

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
csv::internals::_get_col_names_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,internals *this,string_view head,CSVFormat *format)

{
  reference pCVar1;
  CSVFormat *format_00;
  CSVRow local_9c8;
  vector<char,_std::allocator<char>_> trim_chars;
  RowCollection rows;
  stringstream source;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parser;
  
  format_00 = (CSVFormat *)head._M_str;
  std::vector<char,_std::allocator<char>_>::vector(&trim_chars,&format_00->trim_chars);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parser,(char *)head._M_len,(allocator<char> *)&rows);
  std::__cxx11::stringstream::stringstream((stringstream *)&source,(string *)&parser,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&parser);
  ThreadSafeDeque<csv::CSVRow>::ThreadSafeDeque(&rows,100);
  local_9c8.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_9c8.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::StreamParser(&parser,&source,format_00,(ColNamesPtr *)&local_9c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_9c8.data.
              super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  parser.super_IBasicCSVParser._records = &rows;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::next(&parser,10000000);
  pCVar1 = std::_Deque_iterator<csv::CSVRow,_csv::CSVRow_&,_csv::CSVRow_*>::operator[]
                     (&rows.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>.
                       _M_impl.super__Deque_impl_data._M_start,(long)format_00->header);
  local_9c8.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pCVar1->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_9c8.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (pCVar1->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (pCVar1->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pCVar1->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_9c8.row_length = pCVar1->row_length;
  local_9c8.data_start = pCVar1->data_start;
  local_9c8.fields_start = pCVar1->fields_start;
  CSVRow::operator_cast_to_vector(__return_storage_ptr__,&local_9c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_9c8.data.
              super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~StreamParser(&parser);
  ThreadSafeDeque<csv::CSVRow>::~ThreadSafeDeque(&rows);
  std::__cxx11::stringstream::~stringstream((stringstream *)&source);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&trim_chars.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE std::vector<std::string> _get_col_names(csv::string_view head, CSVFormat format) {
            // Parse the CSV
            auto trim_chars = format.get_trim_chars();
            std::stringstream source(head.data());
            RowCollection rows;

            StreamParser<std::stringstream> parser(source, format);
            parser.set_output(rows);
            parser.next();

            return CSVRow(std::move(rows[format.get_header()]));
        }